

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

int xmlGrowCapacity(int capacity,size_t elemSize,int min,int max)

{
  undefined1 auVar1 [16];
  int iVar2;
  int extra;
  int max_local;
  int min_local;
  size_t elemSize_local;
  int capacity_local;
  
  elemSize_local._4_4_ = min;
  if (0 < capacity) {
    if ((capacity < max) &&
       (auVar1._8_8_ = 0, auVar1._0_8_ = elemSize,
       (ulong)(long)capacity <=
       SUB168((ZEXT416(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar1,0))) {
      iVar2 = (capacity + 1) / 2;
      elemSize_local._4_4_ = max;
      if (capacity <= max - iVar2) {
        elemSize_local._4_4_ = capacity + iVar2;
      }
    }
    else {
      elemSize_local._4_4_ = -1;
    }
  }
  return elemSize_local._4_4_;
}

Assistant:

static XML_INLINE int
xmlGrowCapacity(int capacity, size_t elemSize, int min, int max) {
    int extra;

    if (capacity <= 0) {
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        (void) min;
        return(1);
#else
        return(min);
#endif
    }

    if ((capacity >= max) ||
        ((size_t) capacity > SIZE_MAX / 2 / elemSize))
        return(-1);

    /* Grow by 50% */
    extra = (capacity + 1) / 2;

    if (capacity > max - extra)
        return(max);

    return(capacity + extra);
}